

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined4 *newEntries;
  size_t entryCount;
  undefined1 local_23 [3];
  undefined1 local_20;
  undefined1 local_1f;
  undefined2 local_1e;
  undefined4 local_1c;
  
  uVar3 = pc - cfi->currentPC;
  if (uVar3 == 0) goto LAB_0015724a;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (cfi->cie).codeAlignmentFactor;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  auVar2 = auVar2 / auVar1;
  uVar3 = auVar2._0_8_;
  if (uVar3 < 0x40) {
    uVar3 = (ulong)(byte)(auVar2[0] | 0x40);
    newEntries = (undefined4 *)local_23;
LAB_0015723a:
    *(char *)newEntries = (char)uVar3;
    entryCount = 1;
  }
  else {
    if (uVar3 < 0x100) {
      local_23[1] = 2;
      sysbvm_dynarray_addAll(&cfi->buffer,1,local_23 + 1);
      newEntries = (undefined4 *)(local_23 + 2);
      goto LAB_0015723a;
    }
    if (uVar3 < 0x10000) {
      local_20 = 3;
      sysbvm_dynarray_addAll(&cfi->buffer,1,&local_20);
      newEntries = (undefined4 *)&local_1e;
      local_1e = auVar2._0_2_;
      entryCount = 2;
    }
    else {
      if (uVar3 >> 0x20 != 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dwarf.c:243: assertion failure: advanceFactor <= 0xFFFFFFFF"
                  );
      }
      local_1f = 4;
      sysbvm_dynarray_addAll(&cfi->buffer,1,&local_1f);
      newEntries = &local_1c;
      local_1c = auVar2._0_4_;
      entryCount = 4;
    }
  }
  sysbvm_dynarray_addAll(&cfi->buffer,entryCount,newEntries);
LAB_0015724a:
  cfi->currentPC = pc;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc)
{
    size_t advance = pc - cfi->currentPC;
    if(advance)
    {
        size_t advanceFactor = advance / cfi->cie.codeAlignmentFactor;
        if(advanceFactor <= 63)
        {
            sysbvm_dwarf_encodeByte(&cfi->buffer, (DW_OP_CFA_advance_loc << 6) | (uint8_t)advanceFactor);
        }
        else
        {
            if(advanceFactor <= 0xFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc1);
                sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)advanceFactor);
            }
            else if(advanceFactor <= 0xFFFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc2);
                sysbvm_dwarf_encodeWord(&cfi->buffer, (uint16_t)advanceFactor);
            }
            else
            {
                SYSBVM_ASSERT(advanceFactor <= 0xFFFFFFFF);
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc4);
                sysbvm_dwarf_encodeDWord(&cfi->buffer, (uint32_t)advanceFactor);
            }
        }
    }

    cfi->currentPC = pc;
}